

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable_list.h
# Opt level: O1

bool __thiscall hittable_list::hit(hittable_list *this,ray *r,interval ray_t,hit_record *rec)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  bool bVar4;
  shared_ptr<hittable> *object;
  pointer psVar5;
  hit_record temp_rec;
  double local_b0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  double local_58;
  undefined1 uStack_50;
  undefined7 uStack_4f;
  undefined1 uStack_48;
  undefined8 uStack_47;
  
  local_b0 = ray_t.max;
  local_68 = (element_type *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  psVar5 = (this->objects).
           super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->objects).
           super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 == psVar1) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      peVar2 = (psVar5->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar3 = (*peVar2->_vptr_hittable[2])(ray_t.min._0_4_,SUB84(local_b0,0),peVar2,r,&local_98);
      if ((char)iVar3 != '\0') {
        local_b0 = local_58;
        (rec->normal).e[1] = local_78;
        (rec->normal).e[2] = dStack_70;
        (rec->p).e[2] = local_88;
        (rec->normal).e[0] = dStack_80;
        (rec->p).e[0] = local_98;
        (rec->p).e[1] = dStack_90;
        (rec->mat).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(rec->mat).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &_Stack_60);
        rec->t = local_58;
        rec->u = (double)CONCAT71(uStack_4f,uStack_50);
        *(ulong *)((long)&rec->u + 1) = CONCAT17(uStack_48,uStack_4f);
        *(undefined8 *)((long)&rec->v + 1) = uStack_47;
        bVar4 = true;
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
  }
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
  }
  return bVar4;
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {
        hit_record temp_rec;
        bool hit_anything = false;
        auto closest_so_far = ray_t.max;

        for (const auto& object : objects) {
            if (object->hit(r, interval(ray_t.min, closest_so_far), temp_rec)) {
                hit_anything = true;
                closest_so_far = temp_rec.t;
                rec = temp_rec;
            }
        }

        return hit_anything;
    }